

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O3

uchar * nvpair_unpack_nvlist
                  (_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp,size_t nfds,nvlist_t **child)

{
  nvlist_t *nvl;
  uchar *puVar1;
  int *piVar2;
  uchar *puVar3;
  
  if (nvp->nvp_type == 5) {
    if (nvp->nvp_datasize - 1 < *leftp) {
      nvl = nvlist_create(0);
      puVar3 = (uchar *)0x0;
      if (nvl != (nvlist_t *)0x0) {
        puVar1 = nvlist_unpack_header(nvl,ptr,nfds,(_Bool *)0x0,leftp);
        puVar3 = (uchar *)0x0;
        if (puVar1 != (uchar *)0x0) {
          nvp->nvp_data = (uint64_t)nvl;
          *child = nvl;
          puVar3 = puVar1;
        }
      }
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      puVar3 = (uchar *)0x0;
    }
    return puVar3;
  }
  __assert_fail("nvp->nvp_type == 5",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x318,
                "const unsigned char *nvpair_unpack_nvlist(_Bool, nvpair_t *, const unsigned char *, size_t *, size_t, nvlist_t **)"
               );
}

Assistant:

const unsigned char *
nvpair_unpack_nvlist(bool isbe __unused, nvpair_t *nvp,
    const unsigned char *ptr, size_t *leftp, size_t nfds, nvlist_t **child)
{
	nvlist_t *value;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_NVLIST);

	if (*leftp < nvp->nvp_datasize || nvp->nvp_datasize == 0) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	value = nvlist_create(0);
	if (value == NULL)
		return (NULL);

	ptr = nvlist_unpack_header(value, ptr, nfds, NULL, leftp);
	if (ptr == NULL)
		return (NULL);

	nvp->nvp_data = (uint64_t)(uintptr_t)value;
	*child = value;

	return (ptr);
}